

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O2

void print_result(int f,float res,v_array<char> tag,float lb,float ub)

{
  ulong uVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  void *local_1e8;
  ulong local_1e0;
  char temp [30];
  stringstream ss;
  ostream local_190;
  
  if (-1 < f) {
    sprintf(temp,"%f",SUB84((double)res,0));
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::operator<<(&local_190,temp);
    print_tag(&ss,tag);
    std::operator<<(&local_190,' ');
    sprintf(temp,"%f",SUB84((double)lb,0));
    std::operator<<(&local_190,temp);
    std::operator<<(&local_190,' ');
    sprintf(temp,"%f",SUB84((double)ub,0));
    std::operator<<(&local_190,temp);
    std::operator<<(&local_190,'\n');
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::stringbuf::str();
    uVar1 = io_buf::write_file_or_socket(f,local_1e8,local_1e0 & 0xffffffff);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (uVar1 != local_1e0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return;
}

Assistant:

void print_result(int f, float res, v_array<char> tag, float lb, float ub)
{
  if (f >= 0)
  {
    char temp[30];
    sprintf(temp, "%f", res);
    std::stringstream ss;
    ss << temp;
    print_tag(ss, tag);
    ss << ' ';
    sprintf(temp, "%f", lb);
    ss << temp;
    ss << ' ';
    sprintf(temp, "%f", ub);
    ss << temp;
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}